

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvodea.c
# Opt level: O0

int CVodeB(void *cvode_mem,sunrealtype tBout,int itaskB)

{
  double dVar1;
  CVadjMemRec *pCVar2;
  CVodeBMemRec *pCVar3;
  int in_ESI;
  CVodeMem in_RDI;
  undefined4 in_XMM0_Da;
  undefined4 in_XMM0_Db;
  int reachedTBout;
  int isActive;
  int gotCheckpoint;
  sunrealtype tBn;
  sunrealtype tBret;
  sunrealtype tfuzz;
  int flag;
  int sign;
  CVckpntMem ck_mem;
  CVodeBMem tmp_cvB_mem;
  CVodeBMem cvB_mem;
  CVadjMem ca_mem;
  CVodeMem cv_mem;
  sunrealtype in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff88;
  bool bVar4;
  undefined4 in_stack_ffffffffffffff8c;
  CVckpntMem in_stack_ffffffffffffffa0;
  CVodeMem in_stack_ffffffffffffffa8;
  uint local_50;
  CVckpntMemRec *local_48;
  CVodeBMemRec *local_40;
  undefined4 in_stack_ffffffffffffffe0;
  N_Vector yout;
  CVodeMem tout;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  int iVar5;
  
  yout = (N_Vector)CONCAT44(in_XMM0_Db,in_XMM0_Da);
  local_50 = 0;
  if (in_RDI == (CVodeMem)0x0) {
    cvProcessError((CVodeMem)0x0,-0x15,0x565,"CVodeB",
                   "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/cvodes/cvodea.c"
                   ,"cvode_mem = NULL illegal.");
    iVar5 = -0x15;
  }
  else if (in_RDI->cv_adjMallocDone == 0) {
    cvProcessError(in_RDI,-0x65,0x570,"CVodeB",
                   "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/cvodes/cvodea.c"
                   ,"Illegal attempt to call before calling CVodeAdjMalloc.");
    iVar5 = -0x65;
  }
  else {
    pCVar2 = in_RDI->cv_adj_mem;
    if (pCVar2->ca_nbckpbs == 0) {
      cvProcessError(in_RDI,-0x67,0x57a,"CVodeB",
                     "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/cvodes/cvodea.c"
                     ,"No backward problems have been defined yet.");
      iVar5 = -0x67;
    }
    else {
      pCVar3 = pCVar2->cvB_mem;
      if (pCVar2->ca_firstCVodeFcall == 0) {
        iVar5 = -1;
        if (0.0 < pCVar2->ca_tfinal - pCVar2->ca_tinitial) {
          iVar5 = 1;
        }
        local_40 = pCVar3;
        if (pCVar2->ca_firstCVodeBcall != 0) {
          for (; local_40 != (CVodeBMemRec *)0x0; local_40 = local_40->cv_next) {
            dVar1 = local_40->cv_mem->cv_tn;
            if (((double)iVar5 * (dVar1 - pCVar2->ca_tinitial) < 0.0) ||
               ((double)iVar5 * (pCVar2->ca_tfinal - dVar1) < 0.0)) {
              cvProcessError(in_RDI,-0x68,0x59b,"CVodeB",
                             "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/cvodes/cvodea.c"
                             ,
                             "The initial time tB0 for problem %d is outside the interval over which the forward problem was solved."
                             ,local_40->cv_index);
              return -0x68;
            }
            if ((double)iVar5 * (dVar1 - (double)yout) <= 0.0) {
              cvProcessError(in_RDI,-0x16,0x5a3,"CVodeB",
                             "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/cvodes/cvodea.c"
                             ,
                             "The final time tBout is outside the interval over which the forward problem was solved."
                             ,local_40->cv_index);
              return -0x16;
            }
            if ((local_40->cv_f_withSensi != 0) || (local_40->cv_fQ_withSensi != 0)) {
              pCVar2->ca_IMinterpSensi = 1;
            }
          }
          if ((pCVar2->ca_IMinterpSensi != 0) && (pCVar2->ca_IMstoreSensi == 0)) {
            cvProcessError(in_RDI,-0x16,0x5b3,"CVodeB",
                           "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/cvodes/cvodea.c"
                           ,
                           "At least one backward problem requires sensitivities, but they were not stored for interpolation."
                          );
            return -0x16;
          }
          pCVar2->ca_firstCVodeBcall = 0;
        }
        if ((in_ESI == 1) || (in_ESI == 2)) {
          if (((double)iVar5 * ((double)yout - pCVar2->ca_tinitial) < 0.0) ||
             ((double)iVar5 * (pCVar2->ca_tfinal - (double)yout) < 0.0)) {
            in_stack_ffffffffffffffa8 =
                 (CVodeMem)
                 (in_RDI->cv_uround * 100.0 * (ABS(pCVar2->ca_tinitial) + ABS(pCVar2->ca_tfinal)));
            if ((0.0 <= (double)iVar5 * ((double)yout - pCVar2->ca_tinitial)) ||
               ((double)in_stack_ffffffffffffffa8 <= ABS((double)yout - pCVar2->ca_tinitial))) {
              cvProcessError(in_RDI,-0x16,0x5d4,"CVodeB",
                             "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/cvodes/cvodea.c"
                             ,
                             "The final time tBout is outside the interval over which the forward problem was solved."
                            );
              return -0x16;
            }
            yout = (N_Vector)pCVar2->ca_tinitial;
          }
          local_48 = pCVar2->ck_mem;
          bVar4 = false;
          local_40 = pCVar3;
          do {
            while (local_40 == (CVodeBMemRec *)0x0) {
LAB_00113227:
              tout = in_RDI;
              if ((bVar4) || (local_48->ck_next == (CVckpntMemRec *)0x0)) {
                do {
                  local_40 = pCVar3;
                  if ((local_48 != pCVar2->ca_ckpntData) &&
                     (local_50 = CVAdataStore(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0),
                     local_50 != 0)) {
                    return local_50;
                  }
                  for (; local_40 != (CVodeBMemRec *)0x0; local_40 = local_40->cv_next) {
                    bVar4 = true;
                    dVar1 = local_40->cv_mem->cv_tn;
                    if (((dVar1 == local_48->ck_t0) && (!NAN(dVar1) && !NAN(local_48->ck_t0))) &&
                       ((double)iVar5 * ((double)yout - local_48->ck_t0) < 0.0)) {
                      bVar4 = false;
                    }
                    if (((dVar1 == local_48->ck_t0) && (!NAN(dVar1) && !NAN(local_48->ck_t0))) &&
                       (in_ESI == 2)) {
                      bVar4 = false;
                    }
                    if ((double)iVar5 * (dVar1 - local_48->ck_t0) < 0.0) {
                      bVar4 = false;
                    }
                    if (bVar4) {
                      pCVar2->ca_bckpbCrt = local_40;
                      CVodeSetStopTime((void *)CONCAT44(in_stack_ffffffffffffff8c,
                                                        in_stack_ffffffffffffff88),
                                       in_stack_ffffffffffffff80);
                      local_50 = CVode((void *)CONCAT44(in_stack_fffffffffffffffc,
                                                        in_stack_fffffffffffffff8),(sunrealtype)tout
                                       ,yout,(sunrealtype *)
                                             CONCAT44(in_ESI,in_stack_ffffffffffffffe0),
                                       (int)((ulong)in_RDI >> 0x20));
                      local_40->cv_tout = (sunrealtype)in_stack_ffffffffffffffa0;
                      if ((int)local_50 < 0) break;
                    }
                    else {
                      local_50 = 0;
                      local_40->cv_tout = dVar1;
                    }
                  }
                  if ((int)local_50 < 0) {
                    cvProcessError(in_RDI,(int)(ulong)local_50,0x646,"CVodeB",
                                   "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/cvodes/cvodea.c"
                                   ,"Error occurred while integrating backward problem # %d",
                                   local_40->cv_index);
                    return local_50;
                  }
                  if (in_ESI == 2) {
                    return local_50;
                  }
                  bVar4 = true;
                  for (local_40 = pCVar3; local_40 != (CVodeBMemRec *)0x0;
                      local_40 = local_40->cv_next) {
                    if (0.0 < (double)iVar5 * (local_40->cv_tout - (double)yout)) {
                      bVar4 = false;
                      break;
                    }
                  }
                  if (bVar4) {
                    return local_50;
                  }
                  local_48 = local_48->ck_next;
                  in_stack_ffffffffffffff8c = 0;
                } while( true );
              }
              local_48 = local_48->ck_next;
              local_40 = pCVar3;
            }
            dVar1 = local_40->cv_mem->cv_tn;
            if (0.0 < (double)iVar5 * (dVar1 - local_48->ck_t0)) {
              bVar4 = true;
              goto LAB_00113227;
            }
            if (in_ESI == 1) {
              if (((dVar1 == local_48->ck_t0) && (!NAN(dVar1) && !NAN(local_48->ck_t0))) &&
                 (0.0 <= (double)iVar5 * ((double)yout - local_48->ck_t0))) {
                bVar4 = true;
                goto LAB_00113227;
              }
            }
            local_40 = local_40->cv_next;
          } while( true );
        }
        cvProcessError(in_RDI,-0x16,0x5c0,"CVodeB",
                       "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/cvodes/cvodea.c"
                       ,"Illegal value for itaskB. Legal values are CV_NORMAL and CV_ONE_STEP.");
        iVar5 = -0x16;
      }
      else {
        cvProcessError(in_RDI,-0x66,0x584,"CVodeB",
                       "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/cvodes/cvodea.c"
                       ,"Illegal attempt to call before calling CVodeF.");
        iVar5 = -0x66;
      }
    }
  }
  return iVar5;
}

Assistant:

int CVodeB(void* cvode_mem, sunrealtype tBout, int itaskB)
{
  CVodeMem cv_mem;
  CVadjMem ca_mem;
  CVodeBMem cvB_mem, tmp_cvB_mem;
  CVckpntMem ck_mem;
  int sign, flag = 0;
  sunrealtype tfuzz, tBret, tBn;
  sunbooleantype gotCheckpoint, isActive, reachedTBout;

  /* Check if cvode_mem exists */

  if (cvode_mem == NULL)
  {
    cvProcessError(NULL, CV_MEM_NULL, __LINE__, __func__, __FILE__, MSGCV_NO_MEM);
    return (CV_MEM_NULL);
  }
  cv_mem = (CVodeMem)cvode_mem;

  SUNDIALS_MARK_FUNCTION_BEGIN(CV_PROFILER);

  /* Was ASA initialized? */

  if (cv_mem->cv_adjMallocDone == SUNFALSE)
  {
    cvProcessError(cv_mem, CV_NO_ADJ, __LINE__, __func__, __FILE__, MSGCV_NO_ADJ);
    SUNDIALS_MARK_FUNCTION_END(CV_PROFILER);
    return (CV_NO_ADJ);
  }
  ca_mem = cv_mem->cv_adj_mem;

  /* Check if any backward problem has been defined */

  if (ca_mem->ca_nbckpbs == 0)
  {
    cvProcessError(cv_mem, CV_NO_BCK, __LINE__, __func__, __FILE__, MSGCV_NO_BCK);
    SUNDIALS_MARK_FUNCTION_END(CV_PROFILER);
    return (CV_NO_BCK);
  }
  cvB_mem = ca_mem->cvB_mem;

  /* Check whether CVodeF has been called */

  if (ca_mem->ca_firstCVodeFcall)
  {
    cvProcessError(cv_mem, CV_NO_FWD, __LINE__, __func__, __FILE__, MSGCV_NO_FWD);
    SUNDIALS_MARK_FUNCTION_END(CV_PROFILER);
    return (CV_NO_FWD);
  }
  sign = (ca_mem->ca_tfinal - ca_mem->ca_tinitial > ZERO) ? 1 : -1;

  /* If this is the first call, loop over all backward problems and
   *   - check that tB0 is valid
   *   - check that tBout is ahead of tB0 in the backward direction
   *   - check whether we need to interpolate forward sensitivities
   */

  if (ca_mem->ca_firstCVodeBcall)
  {
    tmp_cvB_mem = cvB_mem;

    while (tmp_cvB_mem != NULL)
    {
      tBn = tmp_cvB_mem->cv_mem->cv_tn;

      if ((sign * (tBn - ca_mem->ca_tinitial) < ZERO) ||
          (sign * (ca_mem->ca_tfinal - tBn) < ZERO))
      {
        cvProcessError(cv_mem, CV_BAD_TB0, __LINE__, __func__, __FILE__,
                       MSGCV_BAD_TB0, tmp_cvB_mem->cv_index);
        SUNDIALS_MARK_FUNCTION_END(CV_PROFILER);
        return (CV_BAD_TB0);
      }

      if (sign * (tBn - tBout) <= ZERO)
      {
        cvProcessError(cv_mem, CV_ILL_INPUT, __LINE__, __func__, __FILE__,
                       MSGCV_BAD_TBOUT, tmp_cvB_mem->cv_index);
        SUNDIALS_MARK_FUNCTION_END(CV_PROFILER);
        return (CV_ILL_INPUT);
      }

      if (tmp_cvB_mem->cv_f_withSensi || tmp_cvB_mem->cv_fQ_withSensi)
      {
        ca_mem->ca_IMinterpSensi = SUNTRUE;
      }

      tmp_cvB_mem = tmp_cvB_mem->cv_next;
    }

    if (ca_mem->ca_IMinterpSensi && !ca_mem->ca_IMstoreSensi)
    {
      cvProcessError(cv_mem, CV_ILL_INPUT, __LINE__, __func__, __FILE__,
                     MSGCV_BAD_SENSI);
      SUNDIALS_MARK_FUNCTION_END(CV_PROFILER);
      return (CV_ILL_INPUT);
    }

    ca_mem->ca_firstCVodeBcall = SUNFALSE;
  }

  /* Check if itaskB is legal */

  if ((itaskB != CV_NORMAL) && (itaskB != CV_ONE_STEP))
  {
    cvProcessError(cv_mem, CV_ILL_INPUT, __LINE__, __func__, __FILE__,
                   MSGCV_BAD_ITASKB);
    SUNDIALS_MARK_FUNCTION_END(CV_PROFILER);
    return (CV_ILL_INPUT);
  }

  /* Check if tBout is legal */

  if ((sign * (tBout - ca_mem->ca_tinitial) < ZERO) ||
      (sign * (ca_mem->ca_tfinal - tBout) < ZERO))
  {
    tfuzz = HUNDRED * cv_mem->cv_uround *
            (SUNRabs(ca_mem->ca_tinitial) + SUNRabs(ca_mem->ca_tfinal));
    if ((sign * (tBout - ca_mem->ca_tinitial) < ZERO) &&
        (SUNRabs(tBout - ca_mem->ca_tinitial) < tfuzz))
    {
      tBout = ca_mem->ca_tinitial;
    }
    else
    {
      cvProcessError(cv_mem, CV_ILL_INPUT, __LINE__, __func__, __FILE__,
                     MSGCV_BAD_TBOUT);
      SUNDIALS_MARK_FUNCTION_END(CV_PROFILER);
      return (CV_ILL_INPUT);
    }
  }

  /* Loop through the check points and stop as soon as a backward
   * problem has its tn value behind the current check point's t0_
   * value (in the backward direction) */

  ck_mem = ca_mem->ck_mem;

  gotCheckpoint = SUNFALSE;

  for (;;)
  {
    tmp_cvB_mem = cvB_mem;
    while (tmp_cvB_mem != NULL)
    {
      tBn = tmp_cvB_mem->cv_mem->cv_tn;

      if (sign * (tBn - ck_mem->ck_t0) > ZERO)
      {
        gotCheckpoint = SUNTRUE;
        break;
      }

      if ((itaskB == CV_NORMAL) && (tBn == ck_mem->ck_t0) &&
          (sign * (tBout - ck_mem->ck_t0) >= ZERO))
      {
        gotCheckpoint = SUNTRUE;
        break;
      }

      tmp_cvB_mem = tmp_cvB_mem->cv_next;
    }

    if (gotCheckpoint) { break; }

    if (ck_mem->ck_next == NULL) { break; }

    ck_mem = ck_mem->ck_next;
  }

  /* Starting with the current check point from above, loop over check points
     while propagating backward problems */

  for (;;)
  {
    /* Store interpolation data if not available.
       This is the 2nd forward integration pass */

    if (ck_mem != ca_mem->ca_ckpntData)
    {
      flag = CVAdataStore(cv_mem, ck_mem);
      if (flag != CV_SUCCESS) { break; }
    }

    /* Loop through all backward problems and, if needed,
     * propagate their solution towards tBout */

    tmp_cvB_mem = cvB_mem;
    while (tmp_cvB_mem != NULL)
    {
      /* Decide if current backward problem is "active" in this check point */

      isActive = SUNTRUE;

      tBn = tmp_cvB_mem->cv_mem->cv_tn;

      if ((tBn == ck_mem->ck_t0) && (sign * (tBout - ck_mem->ck_t0) < ZERO))
      {
        isActive = SUNFALSE;
      }
      if ((tBn == ck_mem->ck_t0) && (itaskB == CV_ONE_STEP))
      {
        isActive = SUNFALSE;
      }

      if (sign * (tBn - ck_mem->ck_t0) < ZERO) { isActive = SUNFALSE; }

      if (isActive)
      {
        /* Store the address of current backward problem memory
         * in ca_mem to be used in the wrapper functions */
        ca_mem->ca_bckpbCrt = tmp_cvB_mem;

        /* Integrate current backward problem */
        CVodeSetStopTime(tmp_cvB_mem->cv_mem, ck_mem->ck_t0);
        flag = CVode(tmp_cvB_mem->cv_mem, tBout, tmp_cvB_mem->cv_y, &tBret,
                     itaskB);

        /* Set the time at which we will report solution and/or quadratures */
        tmp_cvB_mem->cv_tout = tBret;

        /* If an error occurred, exit while loop */
        if (flag < 0) { break; }
      }
      else
      {
        flag                 = CV_SUCCESS;
        tmp_cvB_mem->cv_tout = tBn;
      }

      /* Move to next backward problem */

      tmp_cvB_mem = tmp_cvB_mem->cv_next;
    }

    /* If an error occurred, return now */

    if (flag < 0)
    {
      cvProcessError(cv_mem, flag, __LINE__, __func__, __FILE__,
                     MSGCV_BACK_ERROR, tmp_cvB_mem->cv_index);
      SUNDIALS_MARK_FUNCTION_END(CV_PROFILER);
      return (flag);
    }

    /* If in CV_ONE_STEP mode, return now (flag = CV_SUCCESS) */

    if (itaskB == CV_ONE_STEP) { break; }

    /* If all backward problems have successfully reached tBout, return now */

    reachedTBout = SUNTRUE;

    tmp_cvB_mem = cvB_mem;
    while (tmp_cvB_mem != NULL)
    {
      if (sign * (tmp_cvB_mem->cv_tout - tBout) > ZERO)
      {
        reachedTBout = SUNFALSE;
        break;
      }
      tmp_cvB_mem = tmp_cvB_mem->cv_next;
    }

    if (reachedTBout) { break; }

    /* Move check point in linked list to next one */

    ck_mem = ck_mem->ck_next;
  }

  SUNDIALS_MARK_FUNCTION_END(CV_PROFILER);
  return (flag);
}